

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O2

string * __thiscall
tools::xar::serializeHeaderAsJSON_abi_cxx11_
          (string *__return_storage_ptr__,xar *this,XarHeader *header)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  long lVar1;
  allocator<char> local_2d1;
  string local_2d0 [32];
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170 [4];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{",(allocator<char> *)local_170);
  std::__cxx11::to_string(&local_190,*(unsigned_long_long *)this);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*const_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_170,&kOffsetName,&local_190);
  std::operator+(&local_1d0,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  std::operator+(&local_1b0,&local_1d0,"\"");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*const_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_170 + 1,&kUuidName,&local_1b0);
  std::operator+(&local_210,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x28))
  ;
  std::operator+(&local_1f0,&local_210,"\"");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*const_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_170 + 2,&kVersion,&local_1f0);
  std::operator+(&local_250,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x48))
  ;
  std::operator+(&local_230,&local_250,"\"");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*const_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_170 + 3,&kXarexecTarget,&local_230);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"\",\"",&local_2d1);
  join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_2b0,(xar *)local_2d0,(string *)(this + 0x68),in_RCX);
  std::operator+(&local_290,"[\"",&local_2b0);
  std::operator+(&local_270,&local_290,"\"]");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*const_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,&kXarexecTrampolineNames,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_190);
  for (lVar1 = 0; lVar1 != 0x140; lVar1 = lVar1 + 0x40) {
    if (1 < __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  lVar1 = 0x100;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_170[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string serializeHeaderAsJSON(const XarHeader& header) noexcept {
  std::string ret = "{";
  for (const auto& [name, value] :
       std::initializer_list<std::pair<std::string, std::string>>{
           {kOffsetName, std::to_string(header.offset)},
           {kUuidName, "\"" + header.uuid + "\""},
           {kVersion, "\"" + header.version + "\""},
           {kXarexecTarget, "\"" + header.xarexecTarget + "\""},
           {kXarexecTrampolineNames,
            "[\"" + join("\",\"", header.xarexecTrampolineNames) + "\"]"}}) {
    if (ret.size() > 1) {
      ret += ",";
    }
    ret += "\"";
    ret += name;
    ret += "\":";
    ret += value;
  }
  ret += "}";
  return ret;
}